

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O2

bool __thiscall
pegmatite::ASTContainer::construct(ASTContainer *this,InputRange *r,ASTStack *st,ErrorReporter *err)

{
  pointer ppAVar1;
  ASTMember *pAVar2;
  __normal_iterator<pegmatite::ASTMember_**,_std::vector<pegmatite::ASTMember_*,_std::allocator<pegmatite::ASTMember_*>_>_>
  __tmp;
  pointer ppAVar3;
  
  for (ppAVar3 = (this->members).
                 super__Vector_base<pegmatite::ASTMember_*,_std::allocator<pegmatite::ASTMember_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = (this->members).
                super__Vector_base<pegmatite::ASTMember_*,_std::allocator<pegmatite::ASTMember_*>_>.
                _M_impl.super__Vector_impl_data._M_start, ppAVar3 != ppAVar1; ppAVar3 = ppAVar3 + -1
      ) {
    pAVar2 = ppAVar3[-1];
    (*(code *)**(undefined8 **)((long)&pAVar2->field_0x0 + *(long *)(*(long *)pAVar2 + -0x28)))
              ((long)&pAVar2->field_0x0 + *(long *)(*(long *)pAVar2 + -0x28),r,st,err);
  }
  if (ppAVar3 !=
      (this->members).
      super__Vector_base<pegmatite::ASTMember_*,_std::allocator<pegmatite::ASTMember_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    (this->members).
    super__Vector_base<pegmatite::ASTMember_*,_std::allocator<pegmatite::ASTMember_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppAVar1;
  }
  return true;
}

Assistant:

bool ASTContainer::construct(const InputRange &r, ASTStack &st,
                             const ErrorReporter &err)
{
	bool success = true;

	for(auto it = members.rbegin(); it != members.rend(); ++it)
	{
		ASTMember *member = *it;
		success |= member->construct(r, st, err);
	}
	// We don't need the members vector anymore, so clean up the storage it
	// uses.
	members.clear();
	return success;
}